

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

bool __thiscall
slang::ast::Bitstream::canBeSource
          (Bitstream *this,Type *target,StreamingConcatenationExpression *rhs,
          SourceRange assignmentRange,ASTContext *context)

{
  ulong arg;
  SourceRange range;
  bool bVar1;
  uint64_t arg_00;
  Diagnostic *pDVar2;
  SourceLocation this_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  
  this_00 = assignmentRange.endLoc;
  sourceRange.endLoc = assignmentRange.startLoc;
  bVar1 = Type::isBitstreamType((Type *)this,true);
  if (bVar1) {
    if ((((bitmask<slang::ast::ASTFlags> *)((long)this_00 + 0x10))->m_bits & 2) != 0) {
      return true;
    }
    bVar1 = Type::isFixedSize((Type *)this);
    if (!bVar1) {
      return true;
    }
    arg_00 = Type::getBitstreamWidth((Type *)this);
    arg = *(ulong *)&target[1].super_Symbol;
    if (arg <= arg_00) {
      return true;
    }
    sourceRange.startLoc = (SourceLocation)rhs;
    pDVar2 = ASTContext::addDiag((ASTContext *)this_00,(DiagCode)0x2c0007,sourceRange);
    pDVar2 = Diagnostic::operator<<<unsigned_long>(pDVar2,arg_00);
    pDVar2 = Diagnostic::operator<<<unsigned_long>(pDVar2,arg);
  }
  else {
    sourceRange_00.endLoc = sourceRange.endLoc;
    sourceRange_00.startLoc = (SourceLocation)rhs;
    pDVar2 = ASTContext::addDiag((ASTContext *)this_00,(DiagCode)0x2f0007,sourceRange_00);
    pDVar2 = ast::operator<<(pDVar2,(Type *)this);
  }
  range.startLoc = (SourceLocation)(target->super_Symbol).parentScope;
  range.endLoc = (SourceLocation)(target->super_Symbol).nextInScope;
  Diagnostic::operator<<(pDVar2,range);
  return false;
}

Assistant:

bool Bitstream::canBeSource(const Type& target, const StreamingConcatenationExpression& rhs,
                            SourceRange assignmentRange, const ASTContext& context) {
    // No need to checkClassAccess here because a class is never a valid
    // destination bitstream type.
    if (!target.isBitstreamType(true)) {
        context.addDiag(diag::BadStreamTargetType, assignmentRange) << target << rhs.sourceRange;
        return false;
    }

    if (context.inUnevaluatedBranch())
        return true; // No size check in an unevaluated conditional branch
    if (!target.isFixedSize())
        return true; // Sizes checked at constant evaluation or runtime

    auto targetWidth = target.getBitstreamWidth();
    auto sourceWidth = rhs.getBitstreamWidth();
    if (targetWidth < sourceWidth) {
        auto& diag = context.addDiag(diag::BadStreamSize, assignmentRange)
                     << targetWidth << sourceWidth;
        diag << rhs.sourceRange;
        return false;
    }

    return true;
}